

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Account.cpp
# Opt level: O0

void __thiscall L13_3::BankAccount::withdraw(BankAccount *this,double amount)

{
  ostream *poVar1;
  double dVar2;
  double amount_local;
  BankAccount *this_local;
  
  if (0.0 <= amount) {
    dVar2 = Account::get_balance(&this->super_Account);
    if (amount <= dVar2) {
      Account::withdraw(&this->super_Account,amount);
    }
    else {
      std::operator<<((ostream *)&std::cout,"Withdraw failed. not enough remaining balance.\n");
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Withdraw failed. negative value(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,amount);
    std::operator<<(poVar1,") not allowed.\n");
  }
  return;
}

Assistant:

void BankAccount::withdraw(double amount) {
        if (amount < 0) {
            cout << "Withdraw failed. negative value(" << amount << ") not allowed.\n";
            return;
        }
        if (amount > get_balance()) {
            cout << "Withdraw failed. not enough remaining balance.\n";
            return;
        }
        //  call ABC method
        Account::withdraw(amount);
    }